

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<short,long>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  char *pcVar3;
  char *pcVar4;
  idx_t iVar5;
  long lVar6;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar5 = 0;
    do {
      pcVar3 = *(char **)(pdVar1 + iVar5 * 8);
      if (*pcVar3 == '\x01') {
        pcVar4 = *(char **)(pdVar2 + iVar5 * 8);
        if (*pcVar4 == '\0') {
          lVar6 = *(long *)(pcVar3 + 8);
        }
        else {
          lVar6 = *(long *)(pcVar3 + 8);
          if (*(long *)(pcVar4 + 8) <= lVar6) goto LAB_0182f10d;
        }
        *(undefined2 *)(pcVar4 + 2) = *(undefined2 *)(pcVar3 + 2);
        *(long *)(pcVar4 + 8) = lVar6;
        *pcVar4 = '\x01';
      }
LAB_0182f10d:
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}